

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O2

vector<float,_std::allocator<float>_> * __thiscall
sentencepiece::unigram::Lattice::BackwardAlgorithm
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,Lattice *this,
          float inv_theta)

{
  pointer pvVar1;
  Node *pNVar2;
  pointer ppNVar3;
  Node *pNVar4;
  pointer pfVar5;
  uint uVar6;
  uint uVar7;
  pointer ppNVar8;
  float fVar9;
  allocator_type local_4d;
  uint local_4c;
  pointer local_48;
  pointer local_40;
  value_type_conflict5 local_34;
  
  uVar6 = (int)((ulong)((long)(this->surface_).
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->surface_).
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3) - 1;
  uVar7 = 0;
  if (0 < (int)uVar6) {
    uVar7 = uVar6;
  }
  local_34 = 0.0;
  std::vector<float,_std::allocator<float>_>::vector
            (__return_storage_ptr__,
             (this->node_allocator_).chunk_index_ * (this->node_allocator_).chunk_size_ +
             (this->node_allocator_).element_index_,&local_34,&local_4d);
  while (-1 < (int)uVar7) {
    pvVar1 = (this->end_nodes_).
             super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_48 = *(pointer *)
                ((long)&pvVar1[uVar7].
                        super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                        ._M_impl.super__Vector_impl_data + 8);
    local_4c = uVar7;
    for (local_40 = pvVar1[uVar7].
                    super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; local_40 != local_48;
        local_40 = local_40 + 1) {
      pNVar2 = *local_40;
      pvVar1 = (this->begin_nodes_).
               super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppNVar3 = *(pointer *)
                 ((long)&pvVar1[uVar7].
                         super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                         ._M_impl.super__Vector_impl_data + 8);
      for (ppNVar8 = pvVar1[uVar7].
                     super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppNVar8 != ppNVar3;
          ppNVar8 = ppNVar8 + 1) {
        pNVar4 = *ppNVar8;
        pfVar5 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        fVar9 = anon_unknown_0::LogSumExp
                          (pfVar5[pNVar2->node_id],pNVar4->score + pfVar5[pNVar4->node_id],
                           pNVar4 == (Node *)**(long **)&(this->begin_nodes_).
                                                                                                                  
                                                  super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                                  super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                                                  ._M_impl.super__Vector_impl_data);
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start[pNVar2->node_id] = fVar9;
      }
    }
    uVar7 = local_4c - 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> Lattice::BackwardAlgorithm(float inv_theta) const {
  const int len = size();
  std::vector<float> beta(node_allocator_.size(), 0.0);

  for (int pos = len; pos >= 0; --pos) {
    for (Node *lnode : end_nodes_[pos]) {
      for (Node *rnode : begin_nodes_[pos]) {
        beta[lnode->node_id] =
            LogSumExp(beta[lnode->node_id], rnode->score + beta[rnode->node_id],
                      rnode == begin_nodes_[pos][0]);
      }
    }
  }

  return beta;
}